

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Iterator<short,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<short,_true,_std::allocator<unsigned_long>_>::operator++
          (Iterator<short,_true,_std::allocator<unsigned_long>_> *this)

{
  View<short,_true,_std::allocator<unsigned_long>_> *pVVar1;
  pointer puVar2;
  unsigned_long uVar3;
  pointer puVar4;
  size_t sVar5;
  size_t sVar6;
  reference psVar7;
  runtime_error *this_00;
  size_t dimension;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<short,_true,_std::allocator<unsigned_long>_> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00217b3a:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->index_ < *(ulong *)(pVVar1 + 0x30)) {
    this->index_ = this->index_ + 1;
    View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
    if (pVVar1[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x1) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      pVVar1 = this->view_;
      if (this->index_ < *(ulong *)(pVVar1 + 0x30)) {
        View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        puVar4 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (*(int *)(pVVar1 + 0x38) == 1) {
          if (puVar2 != puVar4) {
            dimension = 0;
            do {
              uVar3 = puVar4[dimension];
              sVar5 = View<short,_true,_std::allocator<unsigned_long>_>::shape
                                (this->view_,dimension);
              sVar6 = View<short,_true,_std::allocator<unsigned_long>_>::strides
                                (this->view_,dimension);
              if (uVar3 != sVar5 - 1) goto LAB_00217b0a;
              puVar4 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              this->pointer_ = this->pointer_ + -(sVar6 * puVar4[dimension]);
              puVar4[dimension] = 0;
              dimension = dimension + 1;
              puVar4 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (dimension <
                     (ulong)((long)(this->coordinates_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
          }
        }
        else {
          dimension = (long)puVar2 - (long)puVar4 >> 3;
          do {
            dimension = dimension - 1;
            uVar3 = (this->coordinates_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[dimension];
            sVar5 = View<short,_true,_std::allocator<unsigned_long>_>::shape(this->view_,dimension);
            sVar6 = View<short,_true,_std::allocator<unsigned_long>_>::strides
                              (this->view_,dimension);
            if (uVar3 != sVar5 - 1) goto LAB_00217b0a;
            puVar4 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar6 * puVar4[dimension]);
            puVar4[dimension] = 0;
          } while (dimension != 0);
        }
      }
      else {
        psVar7 = View<short,_true,_std::allocator<unsigned_long>_>::operator()
                           (pVVar1,*(ulong *)(pVVar1 + 0x30) - 1);
        this->pointer_ = psVar7 + 1;
        pVVar1 = this->view_;
        View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if (*(int *)(pVVar1 + 0x38) == 1) {
          puVar4 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar4 = *puVar4 + 1;
        }
        else {
          if (*(long *)this->view_ == 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00217b3a;
          }
          puVar4 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + *(long *)(this->view_ + 0x28) + -1;
          *puVar4 = *puVar4 + 1;
        }
      }
    }
  }
  goto LAB_002179c0;
LAB_00217b0a:
  this->pointer_ = this->pointer_ + sVar6;
  puVar4 = (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + dimension;
  *puVar4 = *puVar4 + 1;
LAB_002179c0:
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}